

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O1

CBlockLocator * __thiscall CChain::GetLocator(CBlockLocator *__return_storage_ptr__,CChain *this)

{
  pointer ppCVar1;
  CBlockIndex *index;
  long in_FS_OFFSET;
  vector<uint256,_std::allocator<uint256>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar1 = (this->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (this->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    index = (CBlockIndex *)0x0;
  }
  else {
    index = ppCVar1[-1];
  }
  LocatorEntries(&local_38,index);
  *(undefined4 *)
   &(__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start =
       local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) =
       local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  *(undefined4 *)
   &(__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) =
       local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CBlockLocator CChain::GetLocator() const
{
    return ::GetLocator(Tip());
}